

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pla.h
# Opt level: O1

Pla_Man_t * Pla_ManAlloc(char *pFileName,int nIns,int nOuts,int nCubes)

{
  Pla_Man_t *pPVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  word *pwVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  pPVar1 = (Pla_Man_t *)calloc(1,0x98);
  pcVar2 = Extra_FileDesignName(pFileName);
  pPVar1->pName = pcVar2;
  if (pFileName == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pFileName);
    pcVar2 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar2,pFileName);
  }
  pPVar1->pSpec = pcVar2;
  pPVar1->nIns = nIns;
  pPVar1->nOuts = nOuts;
  iVar7 = ((nIns >> 5) + 1) - (uint)((nIns & 0x1fU) == 0);
  iVar9 = ((nOuts >> 5) + 1) - (uint)((nOuts & 0x1fU) == 0);
  pPVar1->nInWords = iVar7;
  pPVar1->nOutWords = iVar9;
  if ((pPVar1->vCubes).nCap < nCubes) {
    piVar4 = (pPVar1->vCubes).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)nCubes << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)nCubes << 2);
    }
    (pPVar1->vCubes).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pPVar1->vCubes).nCap = nCubes;
  }
  if (0 < nCubes) {
    piVar4 = (pPVar1->vCubes).pArray;
    uVar6 = 0;
    do {
      piVar4[uVar6] = (int)uVar6;
      uVar6 = uVar6 + 1;
    } while ((uint)nCubes != uVar6);
  }
  (pPVar1->vCubes).nSize = nCubes;
  uVar8 = iVar7 * nCubes;
  if ((pPVar1->vInBits).nCap < (int)uVar8) {
    pwVar5 = (pPVar1->vInBits).pArray;
    if (pwVar5 == (word *)0x0) {
      pwVar5 = (word *)malloc((long)(int)uVar8 << 3);
    }
    else {
      pwVar5 = (word *)realloc(pwVar5,(long)(int)uVar8 << 3);
    }
    (pPVar1->vInBits).pArray = pwVar5;
    if (pwVar5 == (word *)0x0) goto LAB_0035d340;
    (pPVar1->vInBits).nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset((pPVar1->vInBits).pArray,0,(ulong)uVar8 << 3);
  }
  (pPVar1->vInBits).nSize = uVar8;
  uVar8 = iVar9 * nCubes;
  if ((pPVar1->vOutBits).nCap < (int)uVar8) {
    pwVar5 = (pPVar1->vOutBits).pArray;
    if (pwVar5 == (word *)0x0) {
      pwVar5 = (word *)malloc((long)(int)uVar8 << 3);
    }
    else {
      pwVar5 = (word *)realloc(pwVar5,(long)(int)uVar8 << 3);
    }
    (pPVar1->vOutBits).pArray = pwVar5;
    if (pwVar5 == (word *)0x0) {
LAB_0035d340:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (pPVar1->vOutBits).nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset((pPVar1->vOutBits).pArray,0,(ulong)uVar8 << 3);
  }
  (pPVar1->vOutBits).nSize = uVar8;
  return pPVar1;
}

Assistant:

static inline Pla_Man_t * Pla_ManAlloc( char * pFileName, int nIns, int nOuts, int nCubes )
{
    Pla_Man_t * p = ABC_CALLOC( Pla_Man_t, 1 );
    p->pName = Extra_FileDesignName( pFileName );
    p->pSpec = Abc_UtilStrsav( pFileName );
    p->nIns  = nIns;
    p->nOuts = nOuts;
    p->nInWords  = Abc_Bit6WordNum( 2*nIns );
    p->nOutWords = Abc_Bit6WordNum( 2*nOuts );
    Vec_IntFillNatural( &p->vCubes, nCubes );
    Vec_WrdFill( &p->vInBits,  Pla_ManCubeNum(p) * p->nInWords,  0 );
    Vec_WrdFill( &p->vOutBits, Pla_ManCubeNum(p) * p->nOutWords, 0 );
    return p;
}